

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectAddress * __thiscall
Js::CatchScopeWalker::FindPropertyAddress(CatchScopeWalker *this,PropertyId _propId,bool *isConst)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  Type *pTVar2;
  int index;
  IDiagObjectAddress *local_38;
  IDiagObjectAddress *address;
  Type properties;
  
  *isConst = false;
  local_38 = (IDiagObjectAddress *)0x0;
  pLVar1 = (this->debuggerScope->scopeProperties).ptr;
  Memory::Recycler::WBSetBit((char *)&address);
  address = (IDiagObjectAddress *)pLVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&address);
  if (0 < *(int *)&address[2]._vptr_IDiagObjectAddress) {
    index = 0;
    do {
      pTVar2 = JsUtil::
               List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)address,index);
      if (pTVar2->propId == _propId) {
        pTVar2 = JsUtil::
                 List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item((List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *)address,index);
        FetchValueAndAddress(this,pTVar2,(Var *)0x0,&local_38);
        return local_38;
      }
      index = index + 1;
    } while (index < *(int *)&address[2]._vptr_IDiagObjectAddress);
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *CatchScopeWalker::FindPropertyAddress(PropertyId _propId, bool& isConst)
    {
        isConst = false;
        IDiagObjectAddress * address = nullptr;
        auto properties = debuggerScope->scopeProperties;
        for (int i = 0; i < properties->Count(); i++)
        {
            if (properties->Item(i).propId == _propId)
            {
                FetchValueAndAddress(properties->Item(i), nullptr, &address);
                break;
            }
        }

        return address;
    }